

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

string * XPMP2::GetXPSystemPath_abi_cxx11_(void)

{
  int iVar1;
  char s [512];
  undefined1 auStack_208 [512];
  
  if (GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_);
    if (iVar1 != 0) {
      GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_.field_2;
      GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_._M_string_length = 0;
      GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_);
    }
  }
  if (GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_._M_string_length == 0) {
    XPLMGetSystemPath(auStack_208);
    std::__cxx11::string::assign((char *)&GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_);
  }
  return &GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_;
}

Assistant:

const std::string& GetXPSystemPath ()
{
    // Fetch XP's system dir once
    static std::string sysDir;
    if (sysDir.empty()) {
        char s[512];
        XPLMGetSystemPath(s);
        sysDir = s;
    }
    return sysDir;
}